

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void fight_prog_devils_eye(OBJ_DATA *obj,CHAR_DATA *ch)

{
  bool bVar1;
  int iVar2;
  OBJ_DATA *in_RDI;
  undefined1 in_stack_00001332;
  undefined1 in_stack_00001333;
  int in_stack_00001334;
  int in_stack_00001338;
  int in_stack_0000133c;
  CHAR_DATA *in_stack_00001340;
  CHAR_DATA *in_stack_00001348;
  int in_stack_00001368;
  int in_stack_00001370;
  char *in_stack_00001378;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  
  bVar1 = is_worn(in_RDI);
  if ((bVar1) && (iVar2 = number_percent(), iVar2 < 5)) {
    act(in_stack_ffffffffffffffd0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
        (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    act(in_stack_ffffffffffffffd0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
        (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    dice(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    damage_new(in_stack_00001348,in_stack_00001340,in_stack_0000133c,in_stack_00001338,
               in_stack_00001334,(bool)in_stack_00001333,(bool)in_stack_00001332,in_stack_00001368,
               in_stack_00001370,in_stack_00001378);
  }
  return;
}

Assistant:

void fight_prog_devils_eye(OBJ_DATA *obj, CHAR_DATA *ch)
{
	if (!is_worn(obj))
		return;

	if (number_percent() < 5)
	{
		act("The Devil's Eye suddenly pivots and stares directly into $n's face!", ch, 0, ch->fighting, TO_NOTVICT);
		act("The Devil's Eye suddenly pivots and stares directly into your face!", ch, 0, ch->fighting, TO_VICT);
		damage_new(ch, ch->fighting, dice(12, 12), TYPE_UNDEFINED, DAM_SLASH, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "heartquake");
	}
}